

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadeVertices
          (VertexVaryingShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int iVar1;
  VertexPacket *pVVar2;
  long lVar3;
  ulong uVar4;
  Vector<float,_4> res;
  Vec4 color;
  Vec4 local_68;
  Vec4 local_58;
  float local_40 [4];
  
  if (0 < numPackets && *(int *)&(this->super_ShaderProgram).field_0x154 != -1) {
    uVar4 = 0;
    do {
      local_58.m_data[0] = 0.0;
      local_58.m_data[1] = 0.0;
      local_58.m_data[2] = 0.0;
      local_58.m_data[3] = 0.0;
      rr::readVertexAttrib
                (&local_58,inputs + 1,packets[uVar4]->instanceNdx,packets[uVar4]->vertexNdx);
      local_68.m_data[0] = 0.0;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_68,inputs,packets[uVar4]->instanceNdx,packets[uVar4]->vertexNdx);
      pVVar2 = packets[uVar4];
      *(undefined8 *)(pVVar2->position).m_data = local_68.m_data._0_8_;
      *(undefined8 *)((pVVar2->position).m_data + 2) = local_68.m_data._8_8_;
      pVVar2 = packets[uVar4];
      pVVar2->pointSize = 1.0;
      iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
      if (iVar1 == 2) {
        local_68.m_data[0] = 0.0;
        local_68.m_data[1] = 0.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_68.m_data[lVar3] = local_58.m_data[lVar3] * 0.5;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        pVVar2->outputs[0].v.uData[0] = (deUint32)local_68.m_data[0];
        pVVar2->outputs[0].v.uData[1] = (deUint32)local_68.m_data[1];
        pVVar2->outputs[0].v.uData[2] = (deUint32)local_68.m_data[2];
        pVVar2->outputs[0].v.uData[3] = (deUint32)local_68.m_data[3];
        local_40[0] = local_58.m_data[2];
        local_40[1] = local_58.m_data[1];
        local_40[2] = local_58.m_data[0];
        local_40[3] = local_58.m_data[3];
        local_68.m_data[0] = 0.0;
        local_68.m_data[1] = 0.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_68.m_data[lVar3] = local_40[lVar3] * 0.5;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        pVVar2[1].instanceNdx = (int)local_68.m_data[0];
        pVVar2[1].vertexNdx = (int)local_68.m_data[1];
        pVVar2[1].position.m_data[0] = local_68.m_data[2];
        pVVar2[1].position.m_data[1] = local_68.m_data[3];
      }
      else if (iVar1 == 1) {
        pVVar2->outputs[0].v.uData[0] = (deUint32)local_58.m_data[0];
        pVVar2->outputs[0].v.uData[1] = (deUint32)local_58.m_data[1];
        pVVar2->outputs[0].v.uData[2] = (deUint32)local_58.m_data[2];
        pVVar2->outputs[0].v.uData[3] = (deUint32)local_58.m_data[3];
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)numPackets);
  }
  return;
}

Assistant:

void VertexVaryingShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	// vertex shader is no-op
	if (m_vertexOut == -1)
		return;

	for (int ndx = 0; ndx < numPackets; ++ndx)
	{
		const tcu::Vec4 color = rr::readVertexAttribFloat(inputs[1], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);

		packets[ndx]->position = rr::readVertexAttribFloat(inputs[0], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
		packets[ndx]->pointSize = 1.0f;

		switch (m_vertexOut)
		{
			case 0:
				break;

			case 1:
				packets[ndx]->outputs[0] = color;
				break;

			case 2:
				packets[ndx]->outputs[0] = color * 0.5f;
				packets[ndx]->outputs[1] = color.swizzle(2,1,0,3) * 0.5f;
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}